

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

bool __thiscall QString::startsWith(QString *this,QChar c,CaseSensitivity cs)

{
  short sVar1;
  char16_t cVar2;
  
  if ((this->d).size != 0) {
    cVar2 = *(this->d).ptr;
    if (cs != CaseSensitive) {
      sVar1 = (short)((uint)(int)(short)*(ushort *)
                                         (QUnicodeTables::uc_properties +
                                         (ulong)*(ushort *)
                                                 (QUnicodeTables::uc_property_trie +
                                                 (ulong)(((ushort)cVar2 & 0x1f) +
                                                        (uint)*(ushort *)
                                                               (QUnicodeTables::uc_property_trie +
                                                               (ulong)((ushort)cVar2 >> 5) * 2)) * 2
                                                 ) * 0x14 + 0xe) >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)(((ushort)cVar2 & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie +
                                  (ulong)((ushort)cVar2 >> 5) * 2)) * 2) * 0x14 + 0xe) & 1) == 0) {
        cVar2 = sVar1 + cVar2;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar1 * 2) == 1) {
        cVar2 = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar1 * 2 + 2);
      }
      sVar1 = (short)((uint)(int)(short)*(ushort *)
                                         (QUnicodeTables::uc_properties +
                                         (ulong)*(ushort *)
                                                 (QUnicodeTables::uc_property_trie +
                                                 (ulong)(((ushort)c.ucs & 0x1f) +
                                                        (uint)*(ushort *)
                                                               (QUnicodeTables::uc_property_trie +
                                                               (ulong)((ushort)c.ucs >> 5) * 2)) * 2
                                                 ) * 0x14 + 0xe) >> 1);
      if ((*(ushort *)
            (QUnicodeTables::uc_properties +
            (ulong)*(ushort *)
                    (QUnicodeTables::uc_property_trie +
                    (ulong)(((ushort)c.ucs & 0x1f) +
                           (uint)*(ushort *)
                                  (QUnicodeTables::uc_property_trie +
                                  (ulong)((ushort)c.ucs >> 5) * 2)) * 2) * 0x14 + 0xe) & 1) == 0) {
        c.ucs = sVar1 + c.ucs;
      }
      else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar1 * 2) == 1) {
        c.ucs = *(char16_t *)(QUnicodeTables::specialCaseMap + (long)sVar1 * 2 + 2);
      }
    }
    return cVar2 == c.ucs;
  }
  return false;
}

Assistant:

bool QString::startsWith(QChar c, Qt::CaseSensitivity cs) const
{
    if (!size())
        return false;
    if (cs == Qt::CaseSensitive)
        return at(0) == c;
    return foldCase(at(0)) == foldCase(c);
}